

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_repeat_matcher.hpp
# Opt level: O3

bool __thiscall
boost::xpressive::detail::
simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::charset_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<true>,boost::xpressive::detail::basic_chset<char>>>,mpl_::bool_<true>>
::
match_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
          (simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::charset_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<true>,boost::xpressive::detail::basic_chset<char>>>,mpl_::bool_<true>>
           *this,match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *state,long *next)

{
  char *pcVar1;
  bool bVar2;
  char cVar3;
  char *pcVar4;
  char *pcVar5;
  uint uVar6;
  int iVar7;
  matcher_wrapper<boost::xpressive::detail::true_matcher> local_31;
  
  pcVar1 = (state->cur_)._M_current;
  if (*(int *)(this + 0x24) == 0) {
    uVar6 = 0;
  }
  else {
    uVar6 = 0;
    do {
      bVar2 = charset_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<true>,boost::xpressive::detail::basic_chset<char>>
              ::
              match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::true_matcher>>
                        ((charset_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<true>,boost::xpressive::detail::basic_chset<char>>
                          *)this,state,&local_31);
      if (!bVar2) break;
      uVar6 = uVar6 + 1;
    } while (uVar6 < *(uint *)(this + 0x24));
  }
  if (this[0x30] ==
      (simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::charset_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<true>,boost::xpressive::detail::basic_chset<char>>>,mpl_::bool_<true>>
       )0x1) {
    pcVar5 = pcVar1 + ((state->end_)._M_current != pcVar1);
    if (uVar6 < *(uint *)(this + 0x24)) {
      pcVar5 = (state->cur_)._M_current;
    }
    pcVar4 = pcVar1 + ((state->end_)._M_current != pcVar1);
    if (uVar6 != 0) {
      pcVar4 = pcVar5;
    }
    (state->next_search_)._M_current = pcVar4;
  }
  if (uVar6 < *(uint *)(this + 0x20)) {
LAB_0013903d:
    (state->cur_)._M_current = pcVar1;
    bVar2 = false;
  }
  else {
    cVar3 = (**(code **)(*next + 0x10))(next,state);
    bVar2 = true;
    if (cVar3 == '\0') {
      iVar7 = uVar6 + 1;
      do {
        iVar7 = iVar7 + -1;
        if (iVar7 == *(int *)(this + 0x20)) goto LAB_0013903d;
        (state->cur_)._M_current = (state->cur_)._M_current + -1;
        cVar3 = (**(code **)(*next + 0x10))(next,state);
      } while (cVar3 == '\0');
    }
  }
  return bVar2;
}

Assistant:

bool match_(match_state<BidiIter> &state, Next const &next, greedy_slow_tag) const
        {
            int const diff = -static_cast<int>(Xpr::width == unknown_width::value ? this->width_ : Xpr::width);
            unsigned int matches = 0;
            BidiIter const tmp = state.cur_;

            // greedily match as much as we can
            while(matches < this->max_ && this->xpr_.match(state))
            {
                ++matches;
            }

            // If this repeater is at the front of the pattern, note
            // how much of the input we consumed so that a repeated search
            // doesn't have to cover the same ground again.
            if(this->leading_)
            {
                state.next_search_ = (matches && matches < this->max_)
                                   ? state.cur_
                                   : (tmp == state.end_) ? tmp : boost::next(tmp);
            }

            if(this->min_ > matches)
            {
                state.cur_ = tmp;
                return false;
            }

            // try matching the rest of the pattern, and back off if necessary
            for(; ; --matches, std::advance(state.cur_, diff))
            {
                if(next.match(state))
                {
                    return true;
                }
                else if(this->min_ == matches)
                {
                    state.cur_ = tmp;
                    return false;
                }
            }
        }